

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

size_t __thiscall
OpenSSLWrapper::SslConnection::SslPutInData(SslConnection *this,uint8_t *szBuffer,size_t nWriteLen)

{
  int iVar1;
  runtime_error *this_00;
  size_t nWritten;
  
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(byte *)&this->m_iWantState = (byte)this->m_iWantState & 0xfe;
  iVar1 = BIO_write_ex(this->m_wbio);
  if (0 < iVar1) {
    BIO_ctrl((BIO *)this->m_wbio,0xb,0,(void *)0x0);
  }
  return 0;
}

Assistant:

size_t SslConnection::SslPutInData(const uint8_t* szBuffer, size_t nWriteLen)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        m_iWantState &= ~1;
        size_t nWritten = 0;
        const int iResult = BIO_write_ex(m_wbio, szBuffer, nWriteLen, &nWritten);
        if (iResult <= 0)
            return 0;
        BIO_flush(m_wbio);
        return nWritten;
    }